

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Char * getContext(XML_Parser parser)

{
  STRING_POOL *pool;
  undefined8 *puVar1;
  undefined1 uVar2;
  char cVar3;
  undefined1 *puVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  
  if (*(long *)((long)parser + 0x398) == 0) {
    bVar7 = false;
  }
  else {
    if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
       (iVar9 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar9 == 0)) {
LAB_0014fb95:
      bVar6 = false;
      bVar7 = false;
    }
    else {
      puVar4 = *(undefined1 **)((long)parser + 0x430);
      *(undefined1 **)((long)parser + 0x430) = puVar4 + 1;
      *puVar4 = 0x3d;
      uVar10 = *(int *)(*(long *)((long)parser + 0x398) + 0x28) + -1 +
               (uint)(*(char *)((long)parser + 0x488) == '\0');
      bVar6 = true;
      if (0 < (int)uVar10) {
        uVar12 = 0;
        do {
          if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
             (iVar9 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar9 == 0))
          goto LAB_0014fb95;
          puVar4 = *(undefined1 **)((long)parser + 0x430);
          uVar2 = *(undefined1 *)(*(long *)(*(long *)((long)parser + 0x398) + 0x20) + uVar12);
          *(undefined1 **)((long)parser + 0x430) = puVar4 + 1;
          *puVar4 = uVar2;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      bVar7 = true;
    }
    if (!bVar6) {
      return (XML_Char *)0x0;
    }
  }
  puVar14 = *(undefined8 **)((long)parser + 0x308);
  puVar1 = puVar14 + *(long *)((long)parser + 0x310);
  pool = (STRING_POOL *)((long)parser + 0x418);
LAB_0014fbc1:
  do {
    if (puVar14 == puVar1) {
      puVar13 = (undefined8 *)0x0;
    }
    else {
      puVar13 = (undefined8 *)*puVar14;
      puVar14 = puVar14 + 1;
      if (puVar13 == (undefined8 *)0x0) goto LAB_0014fbc1;
    }
    if (puVar13 == (undefined8 *)0x0) {
      iVar9 = 5;
    }
    else if (puVar13[1] == 0) {
      iVar9 = 6;
    }
    else if (bVar7) {
      if ((*(long *)((long)parser + 0x430) != *(long *)((long)parser + 0x428)) ||
         (iVar9 = poolGrow(pool), iVar9 != 0)) {
        puVar4 = *(undefined1 **)((long)parser + 0x430);
        *(undefined1 **)((long)parser + 0x430) = puVar4 + 1;
        *puVar4 = 0xc;
        goto LAB_0014fc2b;
      }
      iVar9 = 1;
LAB_0014fd48:
      bVar7 = true;
    }
    else {
LAB_0014fc2b:
      cVar3 = *(char *)*puVar13;
      pcVar8 = (char *)*puVar13;
      while (cVar3 != '\0') {
        if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
           (iVar9 = poolGrow(pool), iVar9 == 0)) goto LAB_0014fd30;
        cVar3 = *pcVar8;
        pcVar5 = *(char **)((long)parser + 0x430);
        *(char **)((long)parser + 0x430) = pcVar5 + 1;
        *pcVar5 = cVar3;
        cVar3 = pcVar8[1];
        pcVar8 = pcVar8 + 1;
      }
      if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
         (iVar9 = poolGrow(pool), iVar9 == 0)) {
LAB_0014fd30:
        iVar9 = 1;
      }
      else {
        puVar4 = *(undefined1 **)((long)parser + 0x430);
        *(undefined1 **)((long)parser + 0x430) = puVar4 + 1;
        *puVar4 = 0x3d;
        uVar10 = *(int *)(puVar13[1] + 0x28) + -1 + (uint)(*(char *)((long)parser + 0x488) == '\0');
        iVar9 = 0;
        if ((int)uVar10 < 1) goto LAB_0014fd48;
        uVar12 = 0;
        do {
          if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
             (iVar9 = poolGrow(pool), iVar9 == 0)) {
            iVar9 = 1;
            goto LAB_0014fd4e;
          }
          uVar2 = *(undefined1 *)(*(long *)(puVar13[1] + 0x20) + uVar12);
          puVar4 = *(undefined1 **)((long)parser + 0x430);
          *(undefined1 **)((long)parser + 0x430) = puVar4 + 1;
          *puVar4 = uVar2;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
        bVar7 = true;
        iVar9 = 0;
      }
    }
LAB_0014fd4e:
  } while ((iVar9 == 0) || (iVar9 == 6));
  if (iVar9 == 5) {
    puVar14 = *(undefined8 **)((long)parser + 0x290);
    puVar1 = puVar14 + *(long *)((long)parser + 0x298);
LAB_0014fd7a:
    do {
      if (puVar14 == puVar1) {
        puVar13 = (undefined8 *)0x0;
      }
      else {
        puVar13 = (undefined8 *)*puVar14;
        puVar14 = puVar14 + 1;
        if (puVar13 == (undefined8 *)0x0) goto LAB_0014fd7a;
      }
      if (puVar13 == (undefined8 *)0x0) {
        iVar9 = 0xd;
      }
      else if (*(char *)(puVar13 + 7) == '\0') {
        iVar9 = 0xe;
      }
      else {
        if (bVar7) {
          if ((*(long *)((long)parser + 0x430) != *(long *)((long)parser + 0x428)) ||
             (iVar9 = poolGrow(pool), iVar9 != 0)) {
            puVar4 = *(undefined1 **)((long)parser + 0x430);
            *(undefined1 **)((long)parser + 0x430) = puVar4 + 1;
            *puVar4 = 0xc;
            goto LAB_0014fde4;
          }
          iVar9 = 1;
        }
        else {
LAB_0014fde4:
          iVar9 = 0;
          cVar3 = *(char *)*puVar13;
          pcVar8 = (char *)*puVar13;
          while (cVar3 != '\0') {
            if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
               (iVar11 = poolGrow(pool), iVar11 == 0)) {
              iVar9 = 1;
              goto LAB_0014fe50;
            }
            cVar3 = *pcVar8;
            pcVar5 = *(char **)((long)parser + 0x430);
            *(char **)((long)parser + 0x430) = pcVar5 + 1;
            *pcVar5 = cVar3;
            cVar3 = pcVar8[1];
            pcVar8 = pcVar8 + 1;
          }
        }
        bVar7 = true;
      }
LAB_0014fe50:
    } while ((iVar9 == 0) || (iVar9 == 0xe));
    if ((iVar9 == 0xd) &&
       ((*(long *)((long)parser + 0x430) != *(long *)((long)parser + 0x428) ||
        (iVar9 = poolGrow(pool), iVar9 != 0)))) {
      puVar4 = *(undefined1 **)((long)parser + 0x430);
      *(undefined1 **)((long)parser + 0x430) = puVar4 + 1;
      *puVar4 = 0;
      return *(XML_Char **)((long)parser + 0x438);
    }
  }
  return (XML_Char *)0x0;
}

Assistant:

static
const XML_Char *getContext(XML_Parser parser)
{
  HASH_TABLE_ITER iter;
  int needSep = 0;

  if (dtd.defaultPrefix.binding) {
    int i;
    int len;
    if (!poolAppendChar(&tempPool, XML_T('=')))
      return 0;
    len = dtd.defaultPrefix.binding->uriLen;
    if (namespaceSeparator != XML_T('\0'))
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&tempPool, dtd.defaultPrefix.binding->uri[i]))
        return 0;
    needSep = 1;
  }

  hashTableIterInit(&iter, &(dtd.prefixes));
  for (;;) {
    int i;
    int len;
    const XML_Char *s;
    PREFIX *prefix = (PREFIX *)hashTableIterNext(&iter);
    if (!prefix)
      break;
    if (!prefix->binding)
      continue;
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return 0;
    for (s = prefix->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return 0;
    if (!poolAppendChar(&tempPool, XML_T('=')))
      return 0;
    len = prefix->binding->uriLen;
    if (namespaceSeparator != XML_T('\0'))
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&tempPool, prefix->binding->uri[i]))
        return 0;
    needSep = 1;
  }


  hashTableIterInit(&iter, &(dtd.generalEntities));
  for (;;) {
    const XML_Char *s;
    ENTITY *e = (ENTITY *)hashTableIterNext(&iter);
    if (!e)
      break;
    if (!e->open)
      continue;
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return 0;
    for (s = e->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return 0;
    needSep = 1;
  }

  if (!poolAppendChar(&tempPool, XML_T('\0')))
    return 0;
  return tempPool.start;
}